

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O2

void stack_check(StackWord *start68k)

{
  StackWord *pSVar1;
  StackWord SVar2;
  ushort uVar3;
  int __c;
  bool bVar4;
  DLword DVar5;
  DLword DVar6;
  LispPTR LVar7;
  LispPTR LVar8;
  StackWord *pSVar9;
  long lVar10;
  ushort *puVar11;
  DLword local_42;
  undefined2 local_40;
  undefined2 local_3e;
  
  DVar6 = MachineState.pvar[-5];
  DVar5 = StackOffsetFromNative(MachineState.csp);
  if ((DVar6 == DVar5) && (MachineState.csp[1] == 0xa000)) {
    bVar4 = true;
  }
  else {
    if (MachineState.csp <= MachineState.pvar + -10) {
      warn("CURRENTFX >= CurrentStackPTR??\n");
      LVar7 = LAddrFromNative(MachineState.pvar + -10);
      LVar8 = LAddrFromNative(MachineState.csp);
      printf("CURRENTFX=0x%x,CurrentStackPTR=0x%x\n",(ulong)LVar7,(ulong)LVar8);
    }
    puts("set CURRENTFX->nextblock in debugger. But it will be reset after this check ");
    local_42 = MachineState.pvar[-5];
    local_3e = *(undefined2 *)((ulong)(MachineState.csp + 2) ^ 2);
    local_40 = *(undefined2 *)((ulong)(MachineState.csp + 3) ^ 2);
    DVar6 = StackOffsetFromNative(MachineState.csp + 2);
    MachineState.pvar[-5] = DVar6;
    *(undefined2 *)((ulong)(MachineState.csp + 2) ^ 2) = 0xa000;
    *(short *)((ulong)(MachineState.csp + 3) ^ 2) =
         (short)(((int)MachineState.endofstack - (int)MachineState.csp) - 4U >> 1);
    bVar4 = false;
  }
  pSVar9 = start68k;
  if (start68k == (StackWord *)0x0) {
    pSVar9 = (StackWord *)(Stackspace + InterfacePage->stackbase);
  }
  pSVar1 = (StackWord *)(Stackspace + InterfacePage->endofstack);
  if (*(ushort *)((ulong)pSVar1 ^ 2) < 0xe000) {
    puts("?? endstack is not GUARD BLK");
  }
  do {
    if (pSVar1 <= pSVar9) {
      puts("\nStack Check done");
      if (!bVar4) {
        MachineState.pvar[-5] = local_42;
        *(undefined2 *)((ulong)(MachineState.csp + 2) ^ 2) = local_3e;
        *(undefined2 *)((ulong)(MachineState.csp + 3) ^ 2) = local_40;
      }
      return;
    }
    uVar3 = *(ushort *)((ulong)pSVar9 ^ 2) >> 0xd;
    if (uVar3 == 5) {
      SVar2 = *pSVar9;
      if ((ulong)(ushort)SVar2 == 0) {
        warn("FSB freesize = 0!");
      }
      pSVar9 = pSVar9 + (ushort)SVar2;
      __c = 0x46;
    }
    else if (uVar3 == 6) {
      pSVar9 = (StackWord *)((ulong)((uint)(ushort)pSVar9[5] * 2) + (long)Stackspace);
      __c = 0x58;
    }
    else {
      if (uVar3 != 7) {
        lVar10 = 0;
        do {
          puVar11 = (ushort *)((long)&pSVar9->field_0x0 + lVar10 ^ 2);
          if (0x1fff < *puVar11) {
            warn("StackCheck:!=STK_NOTFLG");
            printf("content:0x%x\n",(ulong)*puVar11);
          }
          lVar10 = lVar10 + 4;
        } while( true );
      }
      SVar2 = *pSVar9;
      if ((ulong)(ushort)SVar2 == 0) {
        warn("Guard block freesize = 0!");
      }
      pSVar9 = pSVar9 + (ushort)SVar2;
      __c = 0x47;
    }
    putchar(__c);
    if ((pSVar9 != start68k) && (pSVar1 < pSVar9)) {
      warn("scanptr exceeded end stack");
      printf("scanptr68k=%p endstack68k=%p",pSVar9,pSVar1);
    }
  } while( true );
}

Assistant:

void stack_check(StackWord *start68k) {
  StackWord *scanptr68k;
  StackWord *endstack68k;
  DLword *top_ivar;
  DLword save_nextblock;
  DLword savestack1, savestack2;
  DLword setflg = NIL;
  DLword freesize;

#ifdef FSBCHECK
  bigFSBindex = 0;
  memset((char *)bigFSB, 0, sizeof(bigFSB));
#endif

  if ((CURRENTFX->nextblock != StackOffsetFromNative(CurrentStackPTR)) || (!FSBP(CurrentStackPTR))) {
    if ((DLword *)CURRENTFX >= CurrentStackPTR) {
      WARN("CURRENTFX >= CurrentStackPTR??\n",
           printf("CURRENTFX=0x%x,CurrentStackPTR=0x%x\n", LAddrFromNative(CURRENTFX),
                  LAddrFromNative(CurrentStackPTR)));
    }
    setflg = T;
    printf("set CURRENTFX->nextblock in debugger. But it will be reset after this check \n");
    save_nextblock = CURRENTFX->nextblock;
    savestack1 = GETWORD(CurrentStackPTR + 2);
    savestack2 = GETWORD(CurrentStackPTR + 3);
    CURRENTFX->nextblock = StackOffsetFromNative(CurrentStackPTR + 2);
    GETWORD(CurrentStackPTR + 2) = STK_FSB_WORD;
    GETWORD(CurrentStackPTR + 3) = (((UNSIGNED)EndSTKP - (UNSIGNED)(CurrentStackPTR + 2)) >> 1);
  }

  if (start68k)
    scanptr68k = start68k;
  else
    scanptr68k = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->stackbase);
  endstack68k = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->endofstack);

  if (STKWORD(endstack68k)->flags != STK_GUARD) printf("?? endstack is not GUARD BLK\n");

  while (scanptr68k < endstack68k) {
    switch ((unsigned)(STKWORD(scanptr68k)->flags)) {
      case STK_FSB:
        freesize = FSB_size(scanptr68k);
        if (freesize == 0) { warn("FSB freesize = 0!"); }
#ifdef FSBCHECK
        if (freesize > STACKAREA_SIZE + MINEXTRASTACKWORDS) {
          if (bigFSBindex < 100) {
            bigFSB[bigFSBindex].offset = StackOffsetFromNative(scanptr68k);
            bigFSB[bigFSBindex].size = freesize;
            bigFSBindex++;
          }
        }
#endif
        scanptr68k = (StackWord *)((DLword *)scanptr68k + freesize);
        putchar('F');
        break;

      case STK_GUARD:
        freesize = FSB_size(scanptr68k);
        if (freesize == 0) { warn("Guard block freesize = 0!"); }
        scanptr68k = (StackWord *)((DLword *)scanptr68k + freesize);
        putchar('G');
        break;

      case STK_FX:
        CHECK_FX((FX *)scanptr68k);
        scanptr68k = (StackWord *)NativeAligned2FromStackOffset(((FX *)scanptr68k)->nextblock);
        putchar('X');
        break;

      default:
        top_ivar = (DLword *)scanptr68k;
        while (STKWORD(scanptr68k)->flags != STK_BF) {
          if (STKWORD(scanptr68k)->flags != STK_NOTFLG) {
            WARN("StackCheck:!=STK_NOTFLG", printf("content:0x%x\n", GETWORD((DLword *)scanptr68k)));
          }
          scanptr68k = (StackWord *)((DLword *)scanptr68k + DLWORDSPER_CELL);
        } /* while end */
        CHECK_BF((Bframe *)scanptr68k);
        if (((Bframe *)scanptr68k)->residual) {
          if ((DLword *)scanptr68k != top_ivar)
            printf("Residual has real IVAR:0x%x\n", LAddrFromNative(scanptr68k));
        } else {
          if (((Bframe *)scanptr68k)->ivar != StackOffsetFromNative(top_ivar))
            printf("BF doesn't point TopIVAR:0x%x\n", LAddrFromNative(scanptr68k));
        }
        scanptr68k = (StackWord *)((DLword *)scanptr68k + DLWORDSPER_CELL);
        putchar('B');
        break;

    } /*switch end */

    if (scanptr68k != start68k) {
      if (scanptr68k > endstack68k) {
        WARN("scanptr exceeded end stack",
             printf("scanptr68k=%p endstack68k=%p", (void *)scanptr68k, (void *)endstack68k));
      }
    }
  } /* while end */

#ifdef FSBCHECK
  if (bigFSBindex != 0) {
    int i;

    printf("\nBIG FSB(s):\n");

    for (i = 0; i < bigFSBindex; i++) {
      printf("Offset: 0x%x , Size: 0x%x\n", bigFSB[i].offset, bigFSB[i].size);
    }
  }
#endif
  printf("\nStack Check done\n");
  if (setflg) {
    CURRENTFX->nextblock = save_nextblock;
    GETWORD(CurrentStackPTR + 2) = savestack1;
    GETWORD(CurrentStackPTR + 3) = savestack2;
  }

}